

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::ParsePartialFromString(MessageLite *this,string_conflict *data)

{
  MessageFactory *pMVar1;
  byte bVar2;
  int size;
  uint8 *buffer;
  bool local_ba;
  string_conflict *data_local;
  MessageLite *this_local;
  undefined1 local_80 [8];
  CodedInputStream input;
  
  buffer = (uint8 *)std::__cxx11::string::data();
  size = std::__cxx11::string::size();
  input.extension_factory_ = (MessageFactory *)this;
  io::CodedInputStream::CodedInputStream((CodedInputStream *)local_80,buffer,size);
  pMVar1 = input.extension_factory_;
  (**(code **)(*(long *)input.extension_factory_ + 0x38))();
  bVar2 = (**(code **)(*(long *)pMVar1 + 0x58))(pMVar1,(CodedInputStream *)local_80);
  local_ba = false;
  if ((bVar2 & 1) != 0) {
    local_ba = io::CodedInputStream::ConsumedEntireMessage((CodedInputStream *)local_80);
  }
  io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_80);
  return local_ba;
}

Assistant:

bool MessageLite::ParsePartialFromString(const string& data) {
  return InlineParsePartialFromArray(data.data(), data.size(), this);
}